

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O0

void build_kd_tree_with_data_move(void)

{
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree2;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree1;
  space points;
  max_leaf_size_t max_leaf_size;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *pvVar1;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *this;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *in_stack_fffffffffffffea0;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *in_stack_fffffffffffffeb0;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_stack_fffffffffffffeb8;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_fffffffffffffec0;
  space_type *in_stack_fffffffffffffec8;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *in_stack_fffffffffffffed0;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_b0;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_20;
  max_leaf_size_t local_8;
  
  pico_tree::max_leaf_size_t::max_leaf_size_t(&local_8,0xc);
  pvVar1 = &local_20;
  make_point_set();
  this = &local_b0;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            (&this->space_,pvVar1);
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            (&in_stack_fffffffffffffea0->space_);
  make_point_set();
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            (&in_stack_fffffffffffffea0->space_);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (in_stack_fffffffffffffea0);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (in_stack_fffffffffffffea0);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(this);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(this);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            (&in_stack_fffffffffffffea0->space_);
  return;
}

Assistant:

void build_kd_tree_with_data_move() {
  pico_tree::max_leaf_size_t max_leaf_size = 12;
  auto points = make_point_set();

  pico_tree::kd_tree<space> tree1(std::move(points), max_leaf_size);

  pico_tree::kd_tree<space> tree2(make_point_set(), max_leaf_size);

  query_tree(tree1);

  query_tree(tree2);
}